

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O1

GridSpecsBase * __thiscall
sciplot::LineSpecsOf<sciplot::GridSpecsBase>::dashType
          (LineSpecsOf<sciplot::GridSpecsBase> *this,int value)

{
  long *plVar1;
  long *plVar2;
  int local_5c;
  string local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  local_5c = value;
  internal::str<int>(&local_58,&local_5c);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x18e489);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_28 = *plVar2;
    lStack_20 = plVar1[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar2;
    local_38 = (long *)*plVar1;
  }
  local_30 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_dashtype,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (GridSpecsBase *)this;
}

Assistant:

auto LineSpecsOf<DerivedSpecs>::dashType(int value) -> DerivedSpecs&
{
    m_dashtype = "dashtype " + internal::str(value);
    return static_cast<DerivedSpecs&>(*this);
}